

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O0

void elf64_dynamicentry(GlobalVars *gv,uint64_t tag,uint64_t val,Section *relsec)

{
  uint8_t *puVar1;
  Reloc *r_00;
  long in_RCX;
  lword in_RDX;
  int o;
  Reloc *r;
  unsigned_long offs;
  Elf64_Dyn dyn;
  bool be;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa0;
  unsigned_long in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  Section *in_stack_ffffffffffffffb8;
  Section *sec;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uStack_28;
  
  if (dynamic == (Section *)0x0) {
    ierror("elf64_dynamicentry(): .dynamic was never created");
  }
  else {
    sec = (Section *)dynamic->size;
    write64((bool)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x133302);
    write64((bool)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x133319);
    puVar1 = (uint8_t *)
             re_alloc(in_stack_ffffffffffffffa0,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    dynamic->data = puVar1;
    puVar1 = dynamic->data;
    *(ulong *)(puVar1 + (long)sec) = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    *(ulong *)(puVar1 + 8 + (long)sec) = CONCAT44(uStack_28,in_stack_ffffffffffffffd4);
    dynamic->size = dynamic->size + 0x10;
    if (in_RCX != 0) {
      uVar2 = 8;
      r_00 = newreloc((GlobalVars *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (Section *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)sec,in_stack_ffffffffffffffb8,8,in_stack_ffffffffffffffa8,
                      (uint8_t)in_RCX,in_RDX);
      r_00->flags = r_00->flags | 0x10;
      addreloc(sec,r_00,(uint16_t)((uint)uVar2 >> 0x10),(uint16_t)uVar2,in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void elf64_dynamicentry(struct GlobalVars *gv,uint64_t tag,uint64_t val,
                        struct Section *relsec)
/* store another entry into the .dynamic section, make new relocation with
   relsec in value-field, when nonzero */
{
  if (dynamic) {
    bool be = elf_endianess == _BIG_ENDIAN_;
    struct Elf64_Dyn dyn;
    unsigned long offs = dynamic->size;

    write64(be,dyn.d_tag,tag);
    write64(be,dyn.d_un.d_val,val);
    dynamic->data = re_alloc(dynamic->data,
                             dynamic->size+sizeof(struct Elf64_Dyn));
    memcpy(dynamic->data+offs,&dyn,sizeof(struct Elf64_Dyn));
    dynamic->size += sizeof(struct Elf64_Dyn);

    if (relsec) {
      /* we need a 64-bit R_ABS relocation for d_val */
      struct Reloc *r;
      int o = offsetof(struct Elf64_Dyn,d_un);

      r = newreloc(gv,dynamic,NULL,relsec,0,offs+o,R_ABS,(lword)val);
      r->flags |= RELF_INTERNAL;  /* just for calculating the address */
      addreloc(dynamic,r,0,64,-1);
    }
  }
  else
    ierror("elf64_dynamicentry(): .dynamic was never created");
}